

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schedule.hpp
# Opt level: O2

bool __thiscall Task::contains(Task *this,OperandHandle *operand,bool is_out)

{
  undefined7 in_register_00000011;
  vector<OperandUsage,_std::allocator<OperandUsage>_> *__range1;
  vector<OperandUsage,_std::allocator<OperandUsage>_> *__x;
  pointer pOVar1;
  vector<OperandUsage,_std::allocator<OperandUsage>_> vec;
  vector<OperandUsage,_std::allocator<OperandUsage>_> local_28;
  
  __x = &this->ins;
  if ((int)CONCAT71(in_register_00000011,is_out) != 0) {
    __x = &this->outs;
  }
  std::vector<OperandUsage,_std::allocator<OperandUsage>_>::vector(&local_28,__x);
  do {
    pOVar1 = local_28.super__Vector_base<OperandUsage,_std::allocator<OperandUsage>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pOVar1 == local_28.super__Vector_base<OperandUsage,_std::allocator<OperandUsage>_>._M_impl.
                  super__Vector_impl_data._M_finish) break;
    local_28.super__Vector_base<OperandUsage,_std::allocator<OperandUsage>_>._M_impl.
    super__Vector_impl_data._M_start = pOVar1 + 1;
  } while ((pOVar1->operand).super___shared_ptr<Operand,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
           (operand->super___shared_ptr<Operand,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  std::vector<OperandUsage,_std::allocator<OperandUsage>_>::~vector(&local_28);
  return pOVar1 != local_28.super__Vector_base<OperandUsage,_std::allocator<OperandUsage>_>._M_impl.
                   super__Vector_impl_data._M_finish;
}

Assistant:

bool contains(const OperandHandle &operand, bool is_out=true) const {
        auto vec = is_out ? outs : ins;
        for (auto &usage: vec) {
            if (usage.operand == operand) {
                return true;
            }
        }
        return false;
    }